

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::StreamingListener
          (StreamingListener *this,string *host,string *port)

{
  string *in_RDX;
  SocketWriter *in_RSI;
  unique_ptr<testing::internal::StreamingListener::AbstractSocketWriter,_std::default_delete<testing::internal::StreamingListener::AbstractSocketWriter>_>
  *in_RDI;
  StreamingListener *unaff_retaddr;
  pointer in_stack_ffffffffffffffb8;
  string *in_stack_ffffffffffffffe0;
  
  EmptyTestEventListener::EmptyTestEventListener((EmptyTestEventListener *)in_RDI);
  ((TestEventListener *)&in_RDI->_M_t)->_vptr_TestEventListener =
       (_func_int **)&PTR__StreamingListener_001ff968;
  operator_new(0x50);
  SocketWriter::SocketWriter(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
  std::
  unique_ptr<testing::internal::StreamingListener::AbstractSocketWriter,std::default_delete<testing::internal::StreamingListener::AbstractSocketWriter>>
  ::unique_ptr<std::default_delete<testing::internal::StreamingListener::AbstractSocketWriter>,void>
            (in_RDI,in_stack_ffffffffffffffb8);
  Start(unaff_retaddr);
  return;
}

Assistant:

StreamingListener(const std::string& host, const std::string& port)
      : socket_writer_(new SocketWriter(host, port)) {
    Start();
  }